

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loader_preload(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  char *buf;
  char *size;
  lua_State *in_RDI;
  char *bcdata;
  char *bcname;
  char *name;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  
  L_00 = (lua_State *)
         luaL_checklstring(in_RDI,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                           (size_t *)in_stack_ffffffffffffffe8);
  lua_getfield(L,name._4_4_,bcname);
  iVar1 = lua_type(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (iVar1 != 5) {
    luaL_error(in_RDI,"\'package.preload\' must be a table");
  }
  lua_getfield(L,name._4_4_,bcname);
  iVar1 = lua_type(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (iVar1 == 0) {
    buf = mksymname(L_00,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    size = ll_bcsym(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if ((size == (char *)0x0) ||
       (iVar1 = luaL_loadbuffer(L_00,buf,(size_t)size,in_stack_ffffffffffffffd8), iVar1 != 0)) {
      lua_pushfstring(in_RDI,"\n\tno field package.preload[\'%s\']",L_00);
    }
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_preload(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  lua_getfield(L, LUA_ENVIRONINDEX, "preload");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.preload") " must be a table");
  lua_getfield(L, -1, name);
  if (lua_isnil(L, -1)) {  /* Not found? */
    const char *bcname = mksymname(L, name, SYMPREFIX_BC);
    const char *bcdata = ll_bcsym(NULL, bcname);
    if (bcdata == NULL || luaL_loadbuffer(L, bcdata, ~(size_t)0, name) != 0)
      lua_pushfstring(L, "\n\tno field package.preload['%s']", name);
  }
  return 1;
}